

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::tryUnitPartitioning(string *unit_string,uint64_t match_flags)

{
  byte bVar1;
  pointer pcVar2;
  string *unit;
  pointer pcVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  precise_unit pVar6;
  uint uVar7;
  uint32_t uVar8;
  uint64_t match_flags_00;
  _Alloc_hider _Var9;
  char cVar10;
  unit_data uVar11;
  size_type sVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  size_type sVar14;
  uint uVar15;
  ulong match_flags_01;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  undefined8 uVar16;
  pointer pbVar17;
  pointer pbVar18;
  double dVar19;
  ulong extraout_XMM0_Qb;
  double dVar20;
  pair<double,_unsigned_long> pVar21;
  precise_unit pVar22;
  size_t part;
  precise_unit res;
  precise_unit bunit;
  string ustring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid;
  double local_248;
  size_t local_240;
  double local_238;
  double local_230;
  undefined1 local_228 [12];
  uint uStack_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  precise_unit local_208;
  uint64_t local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  double local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  ulong local_1b0;
  string local_1a8;
  pointer local_188;
  ulong uStack_180;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  pcVar2 = (unit_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + unit_string->_M_string_length);
  unit = (string *)(unit_string->_M_dataplus)._M_p;
  pVar21 = getPrefixMultiplierWord(unit);
  dVar19 = pVar21.first;
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_150,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
               pVar21.second,0xffffffffffffffff);
    tryUnitPartitioning();
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    pVar22 = unit_from_string_internal(&local_b0,match_flags);
    uVar16 = pVar22._8_8_;
    dVar20 = pVar22.multiplier_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      local_238 = pVar22.multiplier_;
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      dVar20 = local_238;
    }
    if (pVar22.base_units_ == (unit_data)0xfa94a488 && NAN(dVar20)) {
      uVar16 = 0xfa94a488;
      dVar19 = NAN;
    }
    else {
      dVar19 = dVar19 * dVar20;
    }
    pVar22.base_units_ = (unit_data)(int)uVar16;
    pVar22.commodity_ = (int)((ulong)uVar16 >> 0x20);
    pVar22.multiplier_ = dVar19;
    goto LAB_003ac142;
  }
  local_240 = (ulong)(*(char *)&(unit->_M_dataplus)._M_p != 'N') * 2 + 1;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_150,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
             local_240);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_1f0,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  bVar1 = local_1f0._M_dataplus._M_p[local_1f0._M_string_length - 1];
  if (((bVar1 == 0x28) || (bVar1 == 0x7b)) || (bVar1 == 0x5b)) {
    local_240 = 1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_1f0);
  }
  uVar15 = (uint)(match_flags >> 0x25) & 7;
  uVar13 = (ulong)uVar15;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = match_flags;
  if (uVar13 <= unit_string->_M_string_length - local_240 &&
      local_240 < unit_string->_M_string_length - 1) {
    local_1b0 = match_flags | 0x400000000;
    local_248 = NAN;
    local_238 = 0.0;
    dVar19 = 2.07707442941207e-314;
    do {
      local_230 = dVar19;
      if (uVar13 <= local_1f0._M_string_length) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        _local_228 = unit_quick_match(&local_1a8,local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        auVar4 = local_228;
        if (((NAN(local_228._0_8_)) && (local_228._8_4_ == -0x56b5b78)) &&
           (2 < local_1f0._M_string_length)) {
          auVar5._8_8_ = 0xfa94a488;
          auVar5._0_8_ = local_228._0_8_;
          auVar4 = auVar5._0_12_;
          if ((byte)(*local_1f0._M_dataplus._M_p + 0xbfU) < 0x1a) {
            *local_1f0._M_dataplus._M_p = *local_1f0._M_dataplus._M_p | 0x20;
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,local_1f0._M_dataplus._M_p,
                       local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
            _local_228 = unit_quick_match(&local_170,local_1f8);
            auVar4 = local_228;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
              auVar4 = local_228;
            }
          }
        }
        if ((!NAN(auVar4._0_8_)) || (auVar4._8_4_ != -0x56b5b78)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 local_240,0xffffffffffffffff);
          local_208 = unit_from_string_internal((string *)&local_110,local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          local_1d0 = local_208.multiplier_;
          if ((!NAN(local_1d0)) || (local_208.base_units_ != -0x56b5b78)) {
            local_188 = (pointer)local_228._0_8_;
            if ((NAN(local_248)) && (SUB84(local_230,0) == -0x56b5b78)) {
              uVar11 = detail::unit_data::operator*
                                 ((unit_data *)(local_228 + 8),&local_208.base_units_);
              local_248 = local_1d0 * (double)local_188;
              local_230 = (double)CONCAT44(local_208.commodity_ | uStack_21c,uVar11);
            }
            else {
              uVar11 = detail::unit_data::operator*
                                 ((unit_data *)(local_228 + 8),&local_208.base_units_);
              uVar7 = uStack_21c;
              uVar8 = local_208.commodity_;
              local_1d0 = local_1d0 * (double)local_188;
              dVar19 = log10(local_1d0);
              local_188 = (pointer)((ulong)dVar19 & 0x7fffffffffffffff);
              uStack_180 = extraout_XMM0_Qb & 0x7fffffffffffffff;
              dVar19 = log10(local_248);
              if ((double)local_188 < ABS(dVar19)) {
                local_230 = (double)CONCAT44(uVar8 | uVar7,uVar11);
                local_248 = local_1d0;
              }
            }
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_1c8,&local_1f0);
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_1f0,(unit_string->_M_dataplus)._M_p[local_240]);
      sVar12 = local_1f0._M_string_length;
      _Var9._M_p = local_1f0._M_dataplus._M_p;
      __pos = local_240 + 1;
      bVar1 = local_1f0._M_dataplus._M_p[local_1f0._M_string_length - 1];
      local_240 = __pos;
      if (((bVar1 == 0x28) || (bVar1 == 0x7b)) || (dVar19 = local_230, bVar1 == 0x5b)) {
        cVar10 = getMatchCharacter(bVar1);
        segmentcheck(unit_string,cVar10,&local_240);
        if ((_Var9._M_p[sVar12 - 1] == 0x28) &&
           (sVar12 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)unit_string,"({[*/",__pos,5), dVar19 = local_230,
           sVar12 < local_240)) goto LAB_003abc4a;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,local_240);
        dVar19 = local_230;
        tryUnitPartitioning();
      }
      while ((bVar1 = local_1f0._M_dataplus._M_p[local_1f0._M_string_length - 1], bVar1 == 0x2d ||
             (bVar1 == 0x5f))) {
        sVar14 = unit_string->_M_string_length;
        if (sVar14 - 1 <= local_240) goto LAB_003abbb5;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&local_1f0,(unit_string->_M_dataplus)._M_p[local_240]);
        local_238 = (double)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        local_240 = local_240 + 1;
      }
      sVar14 = unit_string->_M_string_length;
LAB_003abbb5:
      if ((byte)(bVar1 - 0x30) < 10) {
        for (; (local_240 < sVar14 - 1 &&
               (cVar10 = (unit_string->_M_dataplus)._M_p[local_240],
               cVar10 == '.' || (byte)(cVar10 - 0x30U) < 10)); local_240 = local_240 + 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&local_1f0,cVar10);
          sVar14 = unit_string->_M_string_length;
        }
      }
      if ((sVar14 - 1 <= local_240) || (sVar14 - local_240 < uVar13)) goto LAB_003abc4a;
    } while( true );
  }
  local_248 = NAN;
  local_238 = 0.0;
  dVar19 = 2.07707442941207e-314;
LAB_003abc4a:
  match_flags_00 = local_1f8;
  pVar6._8_8_ = dVar19;
  pVar6.multiplier_ = local_248;
  pVar22._8_8_ = dVar19;
  pVar22.multiplier_ = local_248;
  if ((NAN(local_248)) && (pVar22 = pVar6, SUB84(dVar19,0) == -0x56b5b78)) {
    if (uVar15 < 2) {
      if ((unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] == 'm') {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        _local_228 = unit_quick_match(&local_d0,match_flags_00);
        uVar13 = local_228._8_8_;
        dVar19 = local_228._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((uVar13 & 0xffffffff) != 0xfa94a488 || !NAN(dVar19)) {
          uVar11 = detail::unit_data::operator*
                             ((unit_data *)(local_228 + 8),(unit_data *)((long)&m + 4));
          pVar22.commodity_ = uStack_21c;
          pVar22.base_units_ = uVar11;
          pVar22.multiplier_ = dVar19;
          goto LAB_003ac130;
        }
      }
LAB_003abd43:
      if (((ulong)local_238 & 1) == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,2);
        pVar22 = unit_quick_match((string *)&local_50,match_flags_00);
        dVar19 = pVar22.multiplier_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          local_238 = pVar22.multiplier_;
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          dVar19 = local_238;
        }
        pbVar17 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((pVar22._8_8_ & 0xffffffff) == 0xfa94a488 && NAN(dVar19)) {
          if (unit_string->_M_string_length == 4) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   2,2);
            local_208 = unit_quick_match((string *)&local_70,match_flags_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,2);
            _local_228 = unit_from_string_internal((string *)&local_90,match_flags_00);
            uVar13 = local_228._8_8_;
            dVar19 = local_228._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              local_238 = local_228._0_8_;
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
              dVar19 = local_238;
            }
            if ((uVar13 & 0xffffffff) != 0xfa94a488 || !NAN(dVar19)) {
              pVar22 = precise_unit::operator*(&local_208,(precise_unit *)local_228);
              goto LAB_003ac130;
            }
          }
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
                 2);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_rval(&local_1c8,(const_iterator)pbVar17,(value_type *)local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._0_8_ != &local_218) {
            operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
          }
        }
      }
      pbVar17 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar15 < 2) &&
         ((cVar10 = *(unit_string->_M_dataplus)._M_p, cVar10 == 'V' || (cVar10 == 'A')))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   0,1);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(&local_1c8,(const_iterator)pbVar17,(value_type *)local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != &local_218) {
          operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
        }
      }
    }
    else if (uVar15 == 2) goto LAB_003abd43;
    __s = local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1;
    pbVar17 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start < __s &&
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                  (pbVar17,__s);
        pbVar17 = pbVar17 + 1;
        __s = __s + -1;
      } while (pbVar17 < __s);
    }
    pbVar17 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1b0 = match_flags_00 | 0x6000000000;
      pbVar18 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = (pbVar18->_M_dataplus)._M_p;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar3,pcVar3 + pbVar18->_M_string_length);
        _local_228 = unit_quick_match(&local_f0,local_1f8);
        local_230 = local_228._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        uVar13 = pbVar18->_M_string_length;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   uVar13,0xffffffffffffffff);
        match_flags_01 = local_1f8;
        if (uVar13 < 4) {
          match_flags_01 = local_1b0;
        }
        pVar22 = unit_from_string_internal((string *)&local_130,match_flags_01);
        local_238 = pVar22.multiplier_;
        local_208 = pVar22;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((!NAN(local_238)) || (pVar22.base_units_ != (unit_data)0xfa94a488)) {
          uVar11 = detail::unit_data::operator*((unit_data *)(local_228 + 8),&local_208.base_units_)
          ;
          pVar22.commodity_ = local_208.commodity_ | uStack_21c;
          pVar22.base_units_ = uVar11;
          pVar22.multiplier_ = local_238 * local_230;
          goto LAB_003ac130;
        }
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 != pbVar17);
    }
    pVar22.base_units_ = (unit_data)0xfa94a488;
    pVar22.commodity_ = 0;
    pVar22.multiplier_ = NAN;
  }
LAB_003ac130:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
LAB_003ac142:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return pVar22;
}

Assistant:

static precise_unit tryUnitPartitioning(
    const std::string& unit_string,
    std::uint64_t match_flags)
{
    std::string ustring = unit_string;

    auto mret = getPrefixMultiplierWord(unit_string);
    if (mret.first != 0.0) {
        ustring = unit_string.substr(mret.second);

        auto retunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(retunit)) {
            return {mret.first, retunit};
        }
        return precise::invalid;
    }

    // a newton(N) in front is somewhat common
    // try a round with just a quick partition
    size_t part = (unit_string.front() == 'N') ? 1 : 3;
    ustring = unit_string.substr(0, part);
    if (ustring.back() == '(' || ustring.back() == '[' ||
        ustring.back() == '{') {
        part = 1;
        ustring.pop_back();
    }
    auto minPartitionSize = getMinPartitionSize(match_flags);
    std::vector<std::string> valid;
    precise_unit possible = precise::invalid;
    bool hasSep{false};
    while (part < unit_string.size() - 1) {
        if (unit_string.size() - part < minPartitionSize) {
            break;
        }
        if (ustring.size() >= minPartitionSize) {
            auto res = unit_quick_match(ustring, match_flags);
            if (!is_valid(res) && ustring.size() >= 3) {
                if (ustring.front() >= 'A' &&
                    ustring.front() <= 'Z') {  // check the lower case version
                                               // since we skipped partitioning
                                               // when we did this earlier
                    ustring[0] += 32;
                    res = unit_quick_match(ustring, match_flags);
                }
            }
            if (is_valid(res)) {
                auto bunit = unit_from_string_internal(
                    unit_string.substr(part),
                    match_flags | skip_partition_check);
                if (is_valid(bunit)) {
                    if (!is_valid(possible)) {
                        possible = res * bunit;
                    } else {
                        auto temp = res * bunit;
                        if (std::abs(log10(temp.multiplier())) <
                            std::abs(log10(possible.multiplier()))) {
                            possible = temp;
                        }
                    }
                }
                valid.push_back(ustring);
            }
        }
        ustring.push_back(unit_string[part]);
        ++part;
        if (ustring.back() == '(' || ustring.back() == '[' ||
            ustring.back() == '{') {
            auto start = part;
            segmentcheck(unit_string, getMatchCharacter(ustring.back()), part);
            if (ustring.back() == '(') {
                if (unit_string.find_first_of("({[*/", start) < part) {
                    // this implies that the contents of the parenthesis
                    // must be a standalone segment and should not be
                    // included in a check
                    break;
                }
            }
            ustring = unit_string.substr(0, part);
        }
        while ((ustring.back() == '_' || ustring.back() == '-') &&
               (part < unit_string.size() - 1)) {
            hasSep = true;
            ustring.push_back(unit_string[part]);
            ++part;
        }
        if (isDigitCharacter(ustring.back())) {
            while ((part < unit_string.size() - 1) &&
                   (unit_string[part] == '.' ||
                    isDigitCharacter(unit_string[part]))) {
                ustring.push_back(unit_string[part]);
                ++part;
            }
        }
    }
    if (is_valid(possible)) {
        return possible;
    }
    if (minPartitionSize <= 1) {
        // meter is somewhat common ending so just check that one too
        if (unit_string.back() == 'm') {
            auto res = unit_quick_match(ustring, match_flags);
            if (is_valid(res)) {
                return res * m;
            }
        }
    }
    if (minPartitionSize <= 2 && !hasSep) {
        // now do a quick check with a 2 character string since we skipped that
        // earlier
        auto qm2 = unit_quick_match(unit_string.substr(0, 2), match_flags);
        if (is_valid(qm2)) {
            valid.insert(valid.begin(), unit_string.substr(0, 2));
        } else if (unit_string.size() == 4) {  // length of 4 is a bit odd so
                                               // check the back two characters
                                               // for a quick match
            qm2 = unit_quick_match(unit_string.substr(2, 2), match_flags);
            auto bunit = unit_from_string_internal(
                unit_string.substr(0, 2), match_flags);
            if (is_valid(bunit)) {
                return qm2 * bunit;
            }
        }
    }
    if (minPartitionSize <= 1) {
        // now pick off a couple 1 character units
        if (unit_string.front() == 'V' || unit_string.front() == 'A') {
            valid.insert(valid.begin(), unit_string.substr(0, 1));
        }
    }
    // start with the biggest
    std::reverse(valid.begin(), valid.end());
    for (auto& vd : valid) {
        auto res = unit_quick_match(vd, match_flags);
        auto nmatch_flags = (vd.size() > 3) ?
            match_flags :
            match_flags | minimum_partition_size3;
        auto bunit = unit_from_string_internal(
            unit_string.substr(vd.size()), nmatch_flags);
        if (is_valid(bunit)) {
            return res * bunit;
        }
    }

    return precise::invalid;
}